

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_close.c
# Opt level: O0

int copy_source(zip_t *za,zip_source_t *src,zip_source_t *src_for_length,zip_int64_t data_length)

{
  int iVar1;
  zip_uint64_t length;
  long lVar2;
  zip_int64_t t;
  long lStack_2048;
  int ret;
  zip_int64_t current;
  zip_int64_t n;
  zip_uint8_t buf [8192];
  zip_int64_t data_length_local;
  zip_source_t *src_for_length_local;
  zip_source_t *src_local;
  zip_t *za_local;
  
  iVar1 = zip_source_open(src);
  if (iVar1 < 0) {
    zip_error_set_from_source(&za->error,src);
    za_local._4_4_ = -1;
  }
  else {
    t._4_4_ = 0;
    lStack_2048 = 0;
    do {
      do {
        length = zip_source_read(src,&n,0x2000);
        if ((long)length < 1) goto LAB_00108818;
        iVar1 = _zip_write(za,&n,length);
        if (iVar1 < 0) {
          t._4_4_ = -1;
          goto LAB_00108818;
        }
      } while (((length != 0x2000) || (za->progress == (zip_progress_t *)0x0)) || (data_length < 1))
      ;
      lVar2 = zip_source_tell(src_for_length);
      if (lVar2 < 0) {
        lVar2 = lStack_2048 + 0x2000;
      }
      lStack_2048 = lVar2;
      iVar1 = _zip_progress_update(za->progress,(double)lStack_2048 / (double)data_length);
    } while (iVar1 == 0);
    zip_error_set(&za->error,0x20,0);
    t._4_4_ = -1;
LAB_00108818:
    if ((long)length < 0) {
      zip_error_set_from_source(&za->error,src);
      t._4_4_ = -1;
    }
    zip_source_close(src);
    za_local._4_4_ = t._4_4_;
  }
  return za_local._4_4_;
}

Assistant:

static int
copy_source(zip_t *za, zip_source_t *src, zip_source_t *src_for_length, zip_int64_t data_length) {
    DEFINE_BYTE_ARRAY(buf, BUFSIZE);
    zip_int64_t n, current;
    int ret;

    if (zip_source_open(src) < 0) {
        zip_error_set_from_source(&za->error, src);
        return -1;
    }

    if (!byte_array_init(buf, BUFSIZE)) {
        zip_error_set(&za->error, ZIP_ER_MEMORY, 0);
        return -1;
    }

    ret = 0;
    current = 0;
    while ((n = zip_source_read(src, buf, BUFSIZE)) > 0) {
        if (_zip_write(za, buf, (zip_uint64_t)n) < 0) {
            ret = -1;
            break;
        }
        if (n == BUFSIZE && za->progress && data_length > 0) {
            zip_int64_t t;
            t = zip_source_tell(src_for_length);
            if (t >= 0) {
                current = t;
            } else {
                current += n;
            }
            if (_zip_progress_update(za->progress, (double)current / (double)data_length) != 0) {
                zip_error_set(&za->error, ZIP_ER_CANCELLED, 0);
                ret = -1;
                break;
            }
        }
    }

    if (n < 0) {
        zip_error_set_from_source(&za->error, src);
        ret = -1;
    }

    byte_array_fini(buf);

    zip_source_close(src);

    return ret;
}